

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall QMenuSloppyState::timeout(QMenuSloppyState *this)

{
  long lVar1;
  bool bVar2;
  ushort uVar3;
  QMenuPrivate *pQVar4;
  QMenuSloppyState *in_RDI;
  long in_FS_OFFSET;
  QMenu *in_stack_00000018;
  bool reallyHasMouse;
  QMenuPrivate *menu_priv;
  ResetOnDestroy resetState;
  QPoint lastCursorPos;
  QPointer<QMenu> *in_stack_ffffffffffffff98;
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 uVar5;
  undefined1 uVar6;
  byte local_49;
  QMenuSloppyState *local_38;
  QWidget *in_stack_ffffffffffffffd8;
  undefined1 local_20 [7];
  QMenuPrivate *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = QMenuPrivate::get((QMenu *)0x642a2d);
  uVar3 = *(ushort *)&pQVar4->field_0x420 >> 6;
  local_49 = (byte)uVar3;
  if ((uVar3 & 1) == 0) {
    in_stack_fffffffffffffff0 =
         (QMenuPrivate *)QGuiApplicationPrivate::QLastCursorPosition::toPoint();
    _local_20 = QWidget::frameGeometry(in_stack_ffffffffffffffd8);
    local_49 = QRect::contains((QPoint *)local_20,SUB81(&stack0xfffffffffffffff0,0));
  }
  local_49 = local_49 & 1;
  uVar6 = false;
  if (((pQVar4->currentAction == in_RDI->m_reset_action) &&
      (uVar5 = false, uVar6 = uVar5, local_49 != 0)) &&
     (in_stack_ffffffffffffffa6 = false, uVar6 = in_stack_ffffffffffffffa6,
     pQVar4->currentAction != (QAction *)0x0)) {
    QAction::menu<QMenu*>((QAction *)0x642af1);
    in_stack_ffffffffffffffa6 =
         ::operator==((QMenu **)
                      CONCAT17(uVar5,CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)),
                      in_stack_ffffffffffffff98);
    uVar6 = in_stack_ffffffffffffffa6;
  }
  if ((bool)uVar6 == false) {
    local_38 = (QMenuSloppyState *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar4 = (QMenuPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    ResetOnDestroy::ResetOnDestroy((ResetOnDestroy *)&local_38,in_RDI,&in_RDI->m_init_guard);
    bVar2 = hasParentActiveDelayTimer
                      ((QMenuSloppyState *)
                       CONCAT17(uVar6,CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0))
                      );
    if ((!bVar2) && (bVar2 = QWidget::isVisible((QWidget *)0x642b70), bVar2)) {
      bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QMenu> *)0x642b8f);
      if (bVar2) {
        ::QPointer::operator_cast_to_QMenu_((QPointer<QMenu> *)0x642bac);
        QMenuPrivate::hideMenu(pQVar4,in_stack_00000018);
      }
      if (local_49 == 0) {
        QMenuPrivate::setCurrentAction
                  (in_stack_fffffffffffffff0,(QAction *)resetState.guard,local_20._12_4_,
                   local_20._8_4_,local_20[7]);
      }
      else if (((byte)in_RDI->field_0x6c >> 5 & 1) != 0) {
        QMenuPrivate::setCurrentAction
                  (in_stack_fffffffffffffff0,(QAction *)resetState.guard,local_20._12_4_,
                   local_20._8_4_,local_20[7]);
      }
    }
    ResetOnDestroy::~ResetOnDestroy
              ((ResetOnDestroy *)
               CONCAT17(uVar6,CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenuSloppyState::timeout()
{
    QMenuPrivate *menu_priv = QMenuPrivate::get(m_menu);

    bool reallyHasMouse = menu_priv->hasReceievedEnter;
    if (!reallyHasMouse) {
        // Check whether the menu really has a mouse, because only active popup
        // menu gets the enter/leave events. Currently Cocoa is an exception.
        const QPoint lastCursorPos = QGuiApplicationPrivate::lastCursorPosition.toPoint();
        reallyHasMouse = m_menu->frameGeometry().contains(lastCursorPos);
    }

    if (menu_priv->currentAction == m_reset_action
            && reallyHasMouse
            && (menu_priv->currentAction
                && menu_priv->currentAction->menu() == menu_priv->activeMenu)) {
        return;
    }

    ResetOnDestroy resetState(this, &m_init_guard);

    if (hasParentActiveDelayTimer() || !m_menu->isVisible())
        return;

    if (m_sub_menu)
        menu_priv->hideMenu(m_sub_menu);

    if (reallyHasMouse) {
        if (m_use_reset_action)
            menu_priv->setCurrentAction(m_reset_action, 0);
    } else {
        menu_priv->setCurrentAction(nullptr, 0);
    }
}